

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

oonf_layer2_data *
oonf_layer2_neigh_add_path(char *ifname,netaddr *l2neigh_addr,oonf_layer2_neighbor_index idx)

{
  oonf_layer2_net *l2net_00;
  oonf_layer2_neigh *poVar1;
  oonf_layer2_neigh *l2neigh;
  oonf_layer2_net *l2net;
  oonf_layer2_neighbor_index idx_local;
  netaddr *l2neigh_addr_local;
  char *ifname_local;
  undefined1 local_3b [8];
  oonf_layer2_neigh_key key;
  
  l2net_00 = oonf_layer2_net_add(ifname);
  if (l2net_00 == (oonf_layer2_net *)0x0) {
    ifname_local = (char *)0x0;
  }
  else {
    key.link_id._8_8_ = l2neigh_addr;
    memset(local_3b,0,0x23);
    local_3b = *(undefined1 (*) [8])key.link_id._8_8_;
    key.addr._addr._0_8_ = *(undefined8 *)(key.link_id._8_8_ + 8);
    key.addr._addr._8_2_ = *(undefined2 *)(key.link_id._8_8_ + 0x10);
    poVar1 = oonf_layer2_neigh_add_lid(l2net_00,(oonf_layer2_neigh_key *)local_3b);
    if (poVar1 == (oonf_layer2_neigh *)0x0) {
      ifname_local = (char *)0x0;
    }
    else {
      ifname_local = (char *)(poVar1->data + idx);
    }
  }
  return (oonf_layer2_data *)ifname_local;
}

Assistant:

struct oonf_layer2_data *
oonf_layer2_neigh_add_path(const char *ifname, const struct netaddr *l2neigh_addr, enum oonf_layer2_neighbor_index idx) {
    struct oonf_layer2_net *l2net;
  struct oonf_layer2_neigh *l2neigh;

  /* query layer2 database about neighbor */
  l2net = oonf_layer2_net_add(ifname);
  if (l2net == NULL) {
    return NULL;
  }

  /* look for neighbor specific data */
  l2neigh = oonf_layer2_neigh_add(l2net, l2neigh_addr);
  if (l2neigh == NULL) {
    return NULL;
  }

  return &l2neigh->data[idx];
}